

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O2

void __thiscall
TPZFrontNonSym<std::complex<long_double>_>::DecomposeEquations
          (TPZFrontNonSym<std::complex<long_double>_> *this,int64_t mineq,int64_t maxeq,
          TPZEqnArray<std::complex<long_double>_> *eqnarray)

{
  TPZEqnArray<std::complex<long_double>_>::Reset(eqnarray);
  TPZEqnArray<std::complex<long_double>_>::SetNonSymmetric(eqnarray);
  if (mineq <= maxeq) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/TPZFrontNonSym.cpp"
               ,0xa4);
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::DecomposeEquations(int64_t mineq, int64_t maxeq, TPZEqnArray<TVar> & eqnarray){
	// message #1.1 to eqnarray:TPZEqnArray
	int64_t ieq;
	
	eqnarray.Reset();
	eqnarray.SetNonSymmetric();
	
	for (ieq = mineq; ieq <= maxeq; ieq++) {
		// message #1.2.1 to this:TPZFront
		this->DecomposeOneEquation(ieq, eqnarray);
		//			this->Print("Teste.txt",output);
	}
}